

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall cxxopts::Options::Options(Options *this,string *program,string *help_string)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  allocator local_2e;
  allocator local_2d [13];
  string *local_20;
  string *help_string_local;
  string *program_local;
  Options *this_local;
  
  local_20 = help_string;
  help_string_local = program;
  program_local = &this->m_program;
  std::__cxx11::string::string((string *)this,(string *)program);
  toLocalString<std::__cxx11::string>(&this->m_help_string,(cxxopts *)help_string,t);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->m_custom_help,"[OPTION...]",local_2d);
  std::allocator<char>::~allocator((allocator<char> *)local_2d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->m_positional_help,"positional parameters",&local_2e)
  ;
  std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  this->m_show_positional = false;
  this->m_allow_unrecognised = false;
  this->m_width = 0x4c;
  this->m_tab_expansion = false;
  std::
  make_shared<std::unordered_map<std::__cxx11::string,std::shared_ptr<cxxopts::OptionDetails>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cxxopts::OptionDetails>>>>>
            ();
  memset(&this->m_positional,0,0x18);
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&this->m_positional);
  memset(&this->m_positional_set,0,0x38);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->m_positional_set);
  memset(&this->m_help,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>_>
  ::map(&this->m_help);
  memset(&this->m_option_list,0,0x18);
  std::__cxx11::list<cxxopts::OptionDetails,_std::allocator<cxxopts::OptionDetails>_>::list
            (&this->m_option_list);
  memset(&this->m_option_map,0,0x38);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_List_iterator<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_List_iterator<cxxopts::OptionDetails>_>_>_>
  ::unordered_map(&this->m_option_map);
  return;
}

Assistant:

explicit Options(std::string program, std::string help_string = "")
    : m_program(std::move(program))
    , m_help_string(toLocalString(std::move(help_string)))
    , m_custom_help("[OPTION...]")
    , m_positional_help("positional parameters")
    , m_show_positional(false)
    , m_allow_unrecognised(false)
    , m_width(76)
    , m_tab_expansion(false)
    , m_options(std::make_shared<OptionMap>())
    {
    }